

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O1

void __thiscall kj::_::Mutex::unlock(Mutex *this,Exclusivity exclusivity,Waiter *waiterToSkip)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong in_RAX;
  Mutex *this_00;
  int iVar5;
  Waiter *waiter;
  Waiter *pWVar6;
  
  if (exclusivity == SHARED) {
    LOCK();
    uVar2 = this->futex;
    this->futex = this->futex - 1;
    UNLOCK();
    if (uVar2 != 0x40000001) {
      return;
    }
    LOCK();
    bVar3 = this->futex == 0x40000000;
    if (bVar3) {
      this->futex = 0;
    }
    UNLOCK();
    if (!bVar3) {
      return;
    }
  }
  else {
    if (exclusivity != EXCLUSIVE) {
      return;
    }
    this_00 = this;
    waiter = (this->waitersHead).ptr;
    do {
      if (waiter == (Waiter *)0x0) {
        iVar5 = 5;
        pWVar6 = waiter;
      }
      else {
        pWVar6 = (waiter->next).ptr;
        iVar5 = 0;
        if ((waiter != waiterToSkip) && (bVar3 = checkPredicate(this_00,waiter), bVar3)) {
          if (waiter->hasTimeout == true) {
            LOCK();
            bVar3 = waiter->futex == 0;
            if (bVar3) {
              waiter->futex = 1;
            }
            UNLOCK();
            iVar5 = 6;
            if (!bVar3) goto LAB_001bedd0;
          }
          else {
            waiter->futex = 1;
          }
          in_RAX = in_RAX & 0xffffffff00000000;
          this_00 = (Mutex *)0xca;
          syscall(0xca,&waiter->futex,0x81,0x7fffffff,0,0,in_RAX);
          iVar5 = 1;
        }
      }
LAB_001bedd0:
      waiter = pWVar6;
    } while ((iVar5 == 0) || (iVar5 == 6));
    if (iVar5 != 5) {
      return;
    }
    uVar4 = this->futex;
    do {
      LOCK();
      uVar1 = this->futex;
      bVar3 = uVar4 == uVar1;
      if (bVar3) {
        this->futex = uVar4 & 0x3fffffff;
        uVar1 = uVar4;
      }
      uVar4 = uVar1;
      UNLOCK();
    } while (!bVar3);
    if ((uVar4 & 0x7fffffff) == 0) {
      return;
    }
  }
  syscall(0xca,this,0x81,0x7fffffff,0,0,in_RAX & 0xffffffff00000000);
  return;
}

Assistant:

void Mutex::unlock(Exclusivity exclusivity, Waiter* waiterToSkip) {
  switch (exclusivity) {
    case EXCLUSIVE: {
      KJ_DASSERT(futex & EXCLUSIVE_HELD, "Unlocked a mutex that wasn't locked.");

#ifdef KJ_CONTENTION_WARNING_THRESHOLD
      auto acquiredLocation = releasingExclusive();
#endif

      // First check if there are any conditional waiters. Note we only do this when unlocking an
      // exclusive lock since under a shared lock the state couldn't have changed.
      auto nextWaiter = waitersHead;
      for (;;) {
        KJ_IF_SOME(waiter, nextWaiter) {
          nextWaiter = waiter.next;

          if (&waiter != waiterToSkip && checkPredicate(waiter)) {
            // This waiter's predicate now evaluates true, so wake it up.
            if (waiter.hasTimeout) {
              // In this case we need to be careful to make sure the target thread isn't already
              // processing a timeout, so we need to do an atomic CAS rather than just a store.
              uint expected = 0;
              if (__atomic_compare_exchange_n(&waiter.futex, &expected, 1, false,
                                              __ATOMIC_RELEASE, __ATOMIC_RELAXED)) {
                // Good, we set it to 1, transferring ownership of the mutex. Continue on below.
              } else {
                // Looks like the thread already timed out and set its own futex to 1. In that
                // case it is going to try to lock the mutex itself, so we should NOT attempt an
                // ownership transfer as this will deadlock.
                //
                // We have two options here: We can continue along the waiter list looking for
                // another waiter that's ready to be signaled, or we could drop out of the list
                // immediately since we know that another thread is already waiting for the lock
                // and will re-evaluate the waiter queue itself when it is done. It feels cleaner
                // to me to continue.
                continue;
              }
            } else {
              __atomic_store_n(&waiter.futex, 1, __ATOMIC_RELEASE);
            }
            syscall(SYS_futex, &waiter.futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);

            // We transferred ownership of the lock to this waiter, so we're done now.
            return;
          }
        } else {
          // No more waiters.
          break;
        }
      }

#ifdef KJ_CONTENTION_WARNING_THRESHOLD
      uint readerCount;
      {
        uint oldState = __atomic_load_n(&futex, __ATOMIC_RELAXED);
        readerCount = oldState & SHARED_COUNT_MASK;
        if (readerCount >= KJ_CONTENTION_WARNING_THRESHOLD) {
          // Atomic not needed because we're still holding the exclusive lock.
          printContendedReader = true;
        }
      }
#endif

      // Didn't wake any waiters, so wake normally.
      uint oldState = __atomic_fetch_and(
          &futex, ~(EXCLUSIVE_HELD | EXCLUSIVE_REQUESTED), __ATOMIC_RELEASE);

      if (KJ_UNLIKELY(oldState & ~EXCLUSIVE_HELD)) {
        // Other threads are waiting.  If there are any shared waiters, they now collectively hold
        // the lock, and we must wake them up.  If there are any exclusive waiters, we must wake
        // them up even if readers are waiting so that at the very least they may re-establish the
        // EXCLUSIVE_REQUESTED bit that we just removed.
        syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);

#ifdef KJ_CONTENTION_WARNING_THRESHOLD
        if (readerCount >= KJ_CONTENTION_WARNING_THRESHOLD) {
          KJ_LOG(WARNING, "excessively many readers were waiting on this lock", readerCount,
              acquiredLocation, kj::getStackTrace());
        }
#endif
      }
      break;
    }

    case SHARED: {
      KJ_DASSERT(futex & SHARED_COUNT_MASK, "Unshared a mutex that wasn't shared.");
      uint state = __atomic_sub_fetch(&futex, 1, __ATOMIC_RELEASE);

      // The only case where anyone is waiting is if EXCLUSIVE_REQUESTED is set, and the only time
      // it makes sense to wake up that waiter is if the shared count has reached zero.
      if (KJ_UNLIKELY(state == EXCLUSIVE_REQUESTED)) {
        if (__atomic_compare_exchange_n(
            &futex, &state, 0, false, __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
          // Wake all exclusive waiters.  We have to wake all of them because one of them will
          // grab the lock while the others will re-establish the exclusive-requested bit.
          syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);
        }
      }
      break;
    }
  }